

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gulcalc.cpp
# Opt level: O2

void __thiscall gulcalc::outputcoveragedata(gulcalc *this,int event_id)

{
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *this_00;
  float fVar1;
  long lVar2;
  pointer pvVar3;
  long lVar4;
  ulong uVar5;
  size_t i;
  ulong uVar6;
  int iVar7;
  gulcoverageSampleslevel gc;
  
  if ((this->opt_).coverageLevelOutput == false) {
    return;
  }
  this_00 = &this->cov_;
  pvVar3 = (this->cov_).
           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (uVar5 = 1;
      uVar5 < (ulong)(((long)(this->cov_).
                             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3) / 0x18);
      uVar5 = uVar5 + 1) {
    if (*(pointer *)
         ((long)&pvVar3[uVar5].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data + 8) !=
        pvVar3[uVar5].super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start) {
      gc.coverage_id = (int)uVar5;
      lVar4 = (long)gc.coverage_id;
      iVar7 = -1;
      gc.event_id = event_id;
      for (uVar6 = 1;
          lVar2 = *(long *)&pvVar3[uVar5].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data,
          uVar6 < (ulong)((long)*(pointer *)
                                 ((long)&pvVar3[uVar5].
                                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                         super__Vector_impl_data + 8) - lVar2 >> 2);
          uVar6 = uVar6 + 1) {
        gc.loss = *(float *)(lVar2 + uVar6 * 4);
        fVar1 = (this->coverages_->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar4];
        if (fVar1 < gc.loss) {
          gc.loss = fVar1;
        }
        gc.sidx = iVar7;
        if (((int)uVar6 == 1) || (((int)uVar6 != 2 && (this->loss_threshold_ <= (double)gc.loss))))
        {
          covoutputgul(this,&gc);
        }
        pvVar3 = (this_00->
                 super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        iVar7 = iVar7 + 1;
      }
    }
  }
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::clear(this_00);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::resize(this_00,(long)(this->coverages_->super__Vector_base<float,_std::allocator<float>_>).
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->coverages_->super__Vector_base<float,_std::allocator<float>_>).
                         _M_impl.super__Vector_impl_data._M_start >> 2);
  return;
}

Assistant:

void gulcalc::outputcoveragedata(int event_id)
{
	if (opt_.coverageLevelOutput == false) return;
	for (size_t j = 1; j < cov_.size(); j++) {
		if (cov_[j].size() > 0) {
			gulcoverageSampleslevel gc;
			gc.event_id = event_id;
			gc.coverage_id = j;
			for (size_t i = 1; i < cov_[j].size(); i++) {
				gc.sidx = i - 2;
				gc.loss = cov_[j][i];
				OASIS_FLOAT tiv = (*coverages_)[gc.coverage_id];
				if (gc.loss > tiv) gc.loss = tiv;
				if (gc.sidx) {
					if (gc.sidx == -1) {
						covoutputgul(gc);		// always output the mean	
					}
					else {
						if (gc.loss >= loss_threshold_) {
							covoutputgul(gc);
						}
					}
				}
			}

		}
	}
	cov_.clear();
	cov_.resize(coverages_->size());
}